

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O2

bool __thiscall crnlib::dxt_image::flip_x(dxt_image *this)

{
  element_type eVar1;
  bool bVar2;
  uint uVar3;
  uint x;
  uint x_00;
  uint w;
  uint uVar4;
  uint e;
  ulong uVar5;
  element tmp;
  
  if (((uint)(this->m_format + ~cDXN_YX) < 5) ||
     (uVar4 = this->m_width, 4 < uVar4 && (uVar4 & 3) != 0)) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if (uVar4 != 1) {
      uVar4 = this->m_blocks_x >> 1;
      for (x_00 = 0; uVar4 != x_00; x_00 = x_00 + 1) {
        flip_col(this,x_00);
      }
      if ((this->m_blocks_x & 1) != 0) {
        w = this->m_width;
        if (3 < w) {
          w = 4;
        }
        for (uVar3 = 0; uVar3 < this->m_blocks_y; uVar3 = uVar3 + 1) {
          for (uVar5 = 0; uVar5 < this->m_num_elements_per_block; uVar5 = uVar5 + 1) {
            tmp.m_bytes = *&this->m_pElements
                            [(this->m_blocks_x * uVar3 + uVar4) * this->m_num_elements_per_block +
                             (int)uVar5].m_bytes;
            eVar1 = this->m_element_type[uVar5];
            if (eVar1 == cAlphaDXT5) {
              dxt5_block::flip_x((dxt5_block *)&tmp,w,4);
            }
            else if (eVar1 == cAlphaDXT3) {
              dxt3_block::flip_x((dxt3_block *)&tmp,w,4);
            }
            else if (eVar1 == cColorDXT1) {
              dxt1_block::flip_x((dxt1_block *)&tmp,w,4);
            }
            *&this->m_pElements
              [(this->m_blocks_x * uVar3 + uVar4) * this->m_num_elements_per_block + (int)uVar5].
              m_bytes = tmp.m_bytes;
          }
        }
        bVar2 = true;
      }
    }
  }
  return bVar2;
}

Assistant:

bool dxt_image::flip_x() {
  if (m_format == cETC1 || m_format == cETC2 || m_format == cETC2A || m_format == cETC1S || m_format == cETC2AS) {
    // Can't reliably flip ETCn textures (because of asymmetry in the 555/333 differential coding of subblock colors).
    return false;
  }

  if ((m_width & 3) && (m_width > 4))
    return false;

  if (m_width == 1)
    return true;

  const uint mid_x = m_blocks_x / 2;

  for (uint x = 0; x < mid_x; x++)
    flip_col(x);

  if (m_blocks_x & 1) {
    const uint w = math::minimum(m_width, 4U);
    for (uint y = 0; y < m_blocks_y; y++) {
      for (uint e = 0; e < get_elements_per_block(); e++) {
        element tmp(get_element(mid_x, y, e));
        switch (get_element_type(e)) {
          case cColorDXT1:
            reinterpret_cast<dxt1_block*>(&tmp)->flip_x(w, 4);
            break;
          case cAlphaDXT3:
            reinterpret_cast<dxt3_block*>(&tmp)->flip_x(w, 4);
            break;
          case cAlphaDXT5:
            reinterpret_cast<dxt5_block*>(&tmp)->flip_x(w, 4);
            break;
          default:
            CRNLIB_ASSERT(0);
            break;
        }
        get_element(mid_x, y, e) = tmp;
      }
    }
  }

  return true;
}